

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O3

bool embree::sse42::InstanceArrayIntersector1::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  undefined8 uVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  uint uVar4;
  int iVar5;
  Geometry *pGVar6;
  RTCRayQueryContext *pRVar7;
  long *plVar8;
  long lVar9;
  bool bVar10;
  ulong uVar11;
  long lVar12;
  _func_int *p_Var13;
  float fVar14;
  undefined1 in_XMM0 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar20;
  float fVar21;
  undefined1 in_XMM1 [16];
  undefined1 auVar19 [16];
  vfloat4 l02;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  undefined1 in_XMM4 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar32;
  float fVar33;
  undefined1 auVar34 [12];
  undefined1 in_XMM5 [16];
  undefined1 auVar35 [16];
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 in_XMM7 [16];
  vfloat4 a0;
  float fVar43;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar44 [16];
  undefined1 auVar49 [16];
  float fVar50;
  undefined1 in_XMM11 [16];
  undefined1 auVar51 [16];
  float fVar52;
  undefined1 in_XMM12 [16];
  float fVar53;
  float fVar54;
  RayQueryContext newcontext;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined1 auVar24 [16];
  
  auVar34 = in_XMM5._0_12_;
  uVar4 = prim->primID_;
  pGVar6 = (context->scene->geometries).items[prim->instID_].ptr;
  if ((((*(long *)&pGVar6->field_0x58 == 0) &&
       ((uVar11 = (ulong)*(uint *)(*(long *)&pGVar6[1].time_range.upper +
                                  (long)pGVar6[1].intersectionFilterN * (ulong)uVar4),
        uVar11 == 0xffffffff ||
        (pGVar6[1].super_RefCount._vptr_RefCount[uVar11] == (_func_int *)0x0)))) ||
      ((ray->mask & pGVar6->mask) == 0)) ||
     (pRVar7 = context->user, pRVar7->instID[0] != 0xffffffff)) {
    bVar10 = false;
  }
  else {
    pRVar7->instID[0] = prim->instID_;
    pRVar7->instPrimID[0] = uVar4;
    uVar11 = (ulong)prim->primID_;
    plVar8 = *(long **)&pGVar6[1].fnumTimeSegments;
    iVar5 = (int)plVar8[4];
    if ((pGVar6->field_8).field_0x1 == '\x01') {
      if (iVar5 == 0x9134) {
        lVar9 = *plVar8;
        lVar12 = plVar8[2] * uVar11;
        auVar16 = insertps(ZEXT416(*(uint *)(lVar9 + lVar12)),*(undefined4 *)(lVar9 + 0x10 + lVar12)
                           ,0x1c);
        in_XMM0 = insertps(auVar16,*(undefined4 *)(lVar9 + 0x20 + lVar12),0x28);
        auVar16 = insertps(ZEXT416(*(uint *)(lVar9 + 4 + lVar12)),
                           *(undefined4 *)(lVar9 + 0x14 + lVar12),0x1c);
        in_XMM12 = insertps(auVar16,*(undefined4 *)(lVar9 + 0x24 + lVar12),0x28);
        auVar16 = insertps(ZEXT416(*(uint *)(lVar9 + 8 + lVar12)),
                           *(undefined4 *)(lVar9 + 0x18 + lVar12),0x1c);
        in_XMM11 = insertps(auVar16,*(undefined4 *)(lVar9 + 0x28 + lVar12),0x28);
        auVar16 = insertps(ZEXT416(*(uint *)(lVar9 + 0xc + lVar12)),
                           *(undefined4 *)(lVar9 + 0x1c + lVar12),0x1c);
        in_XMM1 = insertps(auVar16,*(undefined4 *)(lVar9 + 0x2c + lVar12),0x28);
      }
      else if (iVar5 == 0x9234) {
        lVar9 = *plVar8;
        lVar12 = plVar8[2] * uVar11;
        uVar1 = *(undefined8 *)(lVar9 + 4 + lVar12);
        in_XMM0._4_4_ = (float)(int)uVar1;
        in_XMM0._0_4_ = (float)*(undefined4 *)(lVar9 + lVar12);
        in_XMM0._8_4_ = (float)(int)((ulong)uVar1 >> 0x20);
        in_XMM0._12_4_ = 0.0;
        uVar1 = *(undefined8 *)(lVar9 + 0x10 + lVar12);
        in_XMM12._4_4_ = (int)uVar1;
        in_XMM12._0_4_ = *(undefined4 *)(lVar9 + 0xc + lVar12);
        in_XMM12._8_4_ = (int)((ulong)uVar1 >> 0x20);
        in_XMM12._12_4_ = 0;
        uVar1 = *(undefined8 *)(lVar9 + 0x1c + lVar12);
        in_XMM11._4_4_ = (int)uVar1;
        in_XMM11._0_4_ = *(undefined4 *)(lVar9 + 0x18 + lVar12);
        in_XMM11._8_4_ = (int)((ulong)uVar1 >> 0x20);
        in_XMM11._12_4_ = 0;
        uVar1 = *(undefined8 *)(lVar9 + 0x28 + lVar12);
        in_XMM1._4_4_ = (int)uVar1;
        in_XMM1._0_4_ = *(undefined4 *)(lVar9 + 0x24 + lVar12);
        in_XMM1._8_4_ = (int)((ulong)uVar1 >> 0x20);
        in_XMM1._12_4_ = 0;
      }
      else if (iVar5 == 0xb001) {
        lVar9 = *plVar8;
        lVar12 = plVar8[2] * uVar11;
        auVar51._8_8_ = 0;
        auVar51._0_8_ = *(ulong *)(lVar9 + 0x10 + lVar12);
        auVar51 = insertps(auVar51,*(undefined4 *)(lVar9 + 8 + lVar12),0x20);
        uVar1 = *(undefined8 *)(lVar9 + 0x34 + lVar12);
        auVar16._4_4_ = (int)uVar1;
        auVar16._0_4_ = *(undefined4 *)(lVar9 + lVar12);
        auVar16._8_4_ = (int)((ulong)uVar1 >> 0x20);
        auVar16._12_4_ = 0;
        uVar1 = *(undefined8 *)(lVar9 + 0x1c + lVar12);
        auVar30._4_4_ = (int)uVar1;
        auVar30._0_4_ = *(undefined4 *)(lVar9 + 0x18 + lVar12);
        auVar30._8_4_ = (int)((ulong)uVar1 >> 0x20);
        auVar30._12_4_ = 0;
        fVar14 = *(float *)(lVar9 + 0x24 + lVar12);
        fVar27 = *(float *)(lVar9 + 0x28 + lVar12);
        fVar33 = *(float *)(lVar9 + 0x2c + lVar12);
        fVar20 = *(float *)(lVar9 + 0x30 + lVar12);
        fVar36 = fVar20 * fVar20 + fVar33 * fVar33 + fVar14 * fVar14 + fVar27 * fVar27;
        auVar26 = rsqrtss(ZEXT416((uint)fVar36),ZEXT416((uint)fVar36));
        fVar21 = auVar26._0_4_;
        fVar21 = fVar21 * fVar21 * fVar36 * -0.5 * fVar21 + fVar21 * 1.5;
        in_XMM1 = insertps(auVar30,ZEXT416((uint)(fVar14 * fVar21)),0x30);
        in_XMM0 = insertps(auVar16,ZEXT416((uint)(fVar27 * fVar21)),0x30);
        auVar26._0_4_ = fVar21 * fVar20;
        auVar16 = insertps(ZEXT416(*(uint *)(lVar9 + 0xc + lVar12)),
                           *(undefined4 *)(lVar9 + 4 + lVar12),0x10);
        in_XMM11 = insertps(auVar51,auVar26,0x30);
        auVar16 = insertps(auVar16,*(undefined4 *)(lVar9 + 0x3c + lVar12),0x20);
        in_XMM12 = insertps(auVar16,ZEXT416((uint)(fVar33 * fVar21)),0x30);
      }
      else if (iVar5 == 0x9244) {
        lVar9 = *plVar8;
        lVar12 = plVar8[2] * uVar11;
        in_XMM0 = *(undefined1 (*) [16])(lVar9 + lVar12);
        in_XMM12 = *(undefined1 (*) [16])(lVar9 + 0x10 + lVar12);
        in_XMM11 = *(undefined1 (*) [16])(lVar9 + 0x20 + lVar12);
        in_XMM1 = *(undefined1 (*) [16])(lVar9 + 0x30 + lVar12);
      }
      fVar33 = in_XMM1._12_4_;
      fVar14 = in_XMM0._0_4_;
      fVar27 = in_XMM0._12_4_;
      fVar43 = in_XMM12._0_4_;
      fVar45 = in_XMM12._4_4_;
      fVar42 = in_XMM12._12_4_;
      fVar38 = in_XMM11._0_4_;
      fVar40 = in_XMM11._4_4_;
      fVar41 = in_XMM11._8_4_;
      fVar37 = in_XMM11._12_4_;
      fVar36 = fVar27 * fVar42 + fVar37 * fVar33;
      fVar20 = fVar27 * fVar42 - fVar37 * fVar33;
      fVar21 = fVar33 * fVar33 + fVar27 * fVar27 + -fVar42 * fVar42 + -fVar37 * fVar37;
      fVar53 = fVar33 * fVar33 - fVar27 * fVar27;
      fVar50 = fVar42 * fVar42 + fVar53 + -fVar37 * fVar37;
      fVar54 = fVar27 * fVar37 - fVar42 * fVar33;
      fVar39 = fVar42 * fVar33 + fVar27 * fVar37;
      fVar52 = fVar42 * fVar37 + fVar27 * fVar33;
      fVar27 = fVar42 * fVar37 - fVar27 * fVar33;
      fVar36 = fVar36 + fVar36;
      fVar54 = fVar54 + fVar54;
      fVar33 = fVar37 * fVar37 + fVar53 + -fVar42 * fVar42;
      fVar53 = fVar21 * 1.0 + fVar36 * 0.0 + fVar54 * 0.0;
      fVar46 = fVar21 * 0.0 + fVar36 * 1.0 + fVar54 * 0.0;
      fVar48 = fVar21 * 0.0 + fVar36 * 0.0 + fVar54 * 1.0;
      fVar54 = fVar21 * 0.0 + fVar36 * 0.0 + fVar54 * 0.0;
      fVar52 = fVar52 + fVar52;
      fVar20 = fVar20 + fVar20;
      fVar21 = fVar20 * 1.0 + fVar50 * 0.0 + fVar52 * 0.0;
      fVar36 = fVar20 * 0.0 + fVar50 * 1.0 + fVar52 * 0.0;
      fVar37 = fVar20 * 0.0 + fVar50 * 0.0 + fVar52 * 1.0;
      fVar20 = fVar20 * 0.0 + fVar50 * 0.0 + fVar52 * 0.0;
      auVar49._0_8_ = in_XMM0._4_8_;
      auVar49._8_8_ = 0;
      auVar16 = blendps(auVar49,in_XMM12,4);
      fVar39 = fVar39 + fVar39;
      fVar27 = fVar27 + fVar27;
      fVar50 = fVar39 * 1.0 + fVar27 * 0.0 + fVar33 * 0.0;
      fVar52 = fVar39 * 0.0 + fVar27 * 1.0 + fVar33 * 0.0;
      fVar42 = fVar39 * 0.0 + fVar27 * 0.0 + fVar33 * 1.0;
      fVar33 = fVar39 * 0.0 + fVar27 * 0.0 + fVar33 * 0.0;
      local_48._0_4_ = in_XMM1._0_4_;
      local_48._4_4_ = in_XMM1._4_4_;
      uStack_40._0_4_ = in_XMM1._8_4_;
      fVar27 = fVar33 * 0.0;
      in_XMM0._0_4_ = fVar14 * fVar53 + fVar21 * 0.0 + fVar50 * 0.0;
      in_XMM0._4_4_ = fVar14 * fVar46 + fVar36 * 0.0 + fVar52 * 0.0;
      in_XMM0._8_4_ = fVar14 * fVar48 + fVar37 * 0.0 + fVar42 * 0.0;
      in_XMM0._12_4_ = fVar14 * fVar54 + fVar20 * 0.0 + fVar27;
      in_XMM7._0_4_ = fVar43 * fVar53 + fVar45 * fVar21 + fVar50 * 0.0;
      in_XMM7._4_4_ = fVar43 * fVar46 + fVar45 * fVar36 + fVar52 * 0.0;
      in_XMM7._8_4_ = fVar43 * fVar48 + fVar45 * fVar37 + fVar42 * 0.0;
      in_XMM7._12_4_ = fVar43 * fVar54 + fVar45 * fVar20 + fVar27;
      in_XMM4._0_4_ = fVar38 * fVar53 + fVar40 * fVar21 + fVar41 * fVar50;
      in_XMM4._4_4_ = fVar38 * fVar46 + fVar40 * fVar36 + fVar41 * fVar52;
      in_XMM4._8_4_ = fVar38 * fVar48 + fVar40 * fVar37 + fVar41 * fVar42;
      in_XMM4._12_4_ = fVar38 * fVar54 + fVar40 * fVar20 + fVar41 * fVar33;
      auVar34._0_4_ =
           (float)local_48 * fVar53 + local_48._4_4_ * fVar21 + (float)uStack_40 * fVar50 +
           auVar16._0_4_ + 0.0;
      auVar34._4_4_ =
           (float)local_48 * fVar46 + local_48._4_4_ * fVar36 + (float)uStack_40 * fVar52 +
           auVar16._4_4_ + 0.0;
      auVar34._8_4_ =
           (float)local_48 * fVar48 + local_48._4_4_ * fVar37 + (float)uStack_40 * fVar42 +
           auVar16._8_4_ + 0.0;
    }
    else if (iVar5 == 0x9134) {
      lVar9 = *plVar8;
      lVar12 = plVar8[2] * uVar11;
      auVar16 = insertps(ZEXT416(*(uint *)(lVar9 + lVar12)),*(undefined4 *)(lVar9 + 0x10 + lVar12),
                         0x1c);
      in_XMM0 = insertps(auVar16,*(undefined4 *)(lVar9 + 0x20 + lVar12),0x28);
      auVar16 = insertps(ZEXT416(*(uint *)(lVar9 + 4 + lVar12)),
                         *(undefined4 *)(lVar9 + 0x14 + lVar12),0x1c);
      in_XMM7 = insertps(auVar16,*(undefined4 *)(lVar9 + 0x24 + lVar12),0x28);
      auVar16 = insertps(ZEXT416(*(uint *)(lVar9 + 8 + lVar12)),
                         *(undefined4 *)(lVar9 + 0x18 + lVar12),0x1c);
      in_XMM4 = insertps(auVar16,*(undefined4 *)(lVar9 + 0x28 + lVar12),0x28);
      auVar16 = insertps(ZEXT416(*(uint *)(lVar9 + 0xc + lVar12)),
                         *(undefined4 *)(lVar9 + 0x1c + lVar12),0x1c);
      auVar16 = insertps(auVar16,*(undefined4 *)(lVar9 + 0x2c + lVar12),0x28);
      auVar34 = auVar16._0_12_;
    }
    else if (iVar5 == 0x9234) {
      lVar9 = *plVar8;
      lVar12 = plVar8[2] * uVar11;
      uVar1 = *(undefined8 *)(lVar9 + 4 + lVar12);
      in_XMM0._4_4_ = (float)(int)uVar1;
      in_XMM0._0_4_ = (float)*(undefined4 *)(lVar9 + lVar12);
      in_XMM0._8_4_ = (float)(int)((ulong)uVar1 >> 0x20);
      in_XMM0._12_4_ = 0.0;
      uVar1 = *(undefined8 *)(lVar9 + 0x10 + lVar12);
      in_XMM7._4_4_ = (float)(int)uVar1;
      in_XMM7._0_4_ = (float)*(undefined4 *)(lVar9 + 0xc + lVar12);
      in_XMM7._8_4_ = (float)(int)((ulong)uVar1 >> 0x20);
      in_XMM7._12_4_ = 0.0;
      uVar1 = *(undefined8 *)(lVar9 + 0x1c + lVar12);
      in_XMM4._4_4_ = (float)(int)uVar1;
      in_XMM4._0_4_ = (float)*(undefined4 *)(lVar9 + 0x18 + lVar12);
      in_XMM4._8_4_ = (float)(int)((ulong)uVar1 >> 0x20);
      in_XMM4._12_4_ = 0.0;
      uVar1 = *(undefined8 *)(lVar9 + 0x28 + lVar12);
      auVar34._4_4_ = (float)(int)uVar1;
      auVar34._0_4_ = (float)*(undefined4 *)(lVar9 + 0x24 + lVar12);
      auVar34._8_4_ = (float)(int)((ulong)uVar1 >> 0x20);
    }
    else if (iVar5 == 0xb001) {
      lVar9 = *plVar8;
      lVar12 = plVar8[2] * uVar11;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = *(ulong *)(lVar9 + 0x10 + lVar12);
      auVar16 = insertps(auVar28,*(undefined4 *)(lVar9 + 8 + lVar12),0x20);
      uVar1 = *(undefined8 *)(lVar9 + 0x34 + lVar12);
      auVar15._4_4_ = (int)uVar1;
      auVar15._0_4_ = *(undefined4 *)(lVar9 + lVar12);
      auVar15._8_4_ = (int)((ulong)uVar1 >> 0x20);
      auVar15._12_4_ = 0;
      uVar1 = *(undefined8 *)(lVar9 + 0x1c + lVar12);
      auVar35._4_4_ = (int)uVar1;
      auVar35._0_4_ = *(undefined4 *)(lVar9 + 0x18 + lVar12);
      auVar35._8_4_ = (int)((ulong)uVar1 >> 0x20);
      auVar35._12_4_ = 0;
      fVar14 = *(float *)(lVar9 + 0x24 + lVar12);
      fVar27 = *(float *)(lVar9 + 0x28 + lVar12);
      fVar33 = *(float *)(lVar9 + 0x2c + lVar12);
      fVar20 = *(float *)(lVar9 + 0x30 + lVar12);
      fVar36 = fVar20 * fVar20 + fVar33 * fVar33 + fVar14 * fVar14 + fVar27 * fVar27;
      auVar30 = rsqrtss(ZEXT416((uint)fVar36),ZEXT416((uint)fVar36));
      fVar21 = auVar30._0_4_;
      auVar44._4_12_ = auVar30._4_12_;
      fVar21 = fVar21 * fVar21 * fVar36 * -0.5 * fVar21 + fVar21 * 1.5;
      auVar30 = insertps(auVar35,ZEXT416((uint)(fVar14 * fVar21)),0x30);
      auVar34 = auVar30._0_12_;
      in_XMM0 = insertps(auVar15,ZEXT416((uint)(fVar27 * fVar21)),0x30);
      auVar44._0_4_ = fVar21 * fVar20;
      auVar30 = insertps(ZEXT416(*(uint *)(lVar9 + 0xc + lVar12)),
                         *(undefined4 *)(lVar9 + 4 + lVar12),0x10);
      in_XMM4 = insertps(auVar16,auVar44,0x30);
      auVar16 = insertps(auVar30,*(undefined4 *)(lVar9 + 0x3c + lVar12),0x20);
      in_XMM7 = insertps(auVar16,ZEXT416((uint)(fVar33 * fVar21)),0x30);
    }
    else if (iVar5 == 0x9244) {
      lVar9 = *plVar8;
      lVar12 = plVar8[2] * uVar11;
      in_XMM0 = *(undefined1 (*) [16])(lVar9 + lVar12);
      in_XMM7 = *(undefined1 (*) [16])(lVar9 + 0x10 + lVar12);
      in_XMM4 = *(undefined1 (*) [16])(lVar9 + 0x20 + lVar12);
      auVar34 = SUB1612(*(undefined1 (*) [16])(lVar9 + 0x30 + lVar12),0);
    }
    fVar36 = in_XMM4._0_4_;
    fVar37 = in_XMM4._4_4_;
    fVar39 = in_XMM4._8_4_;
    fVar50 = in_XMM4._12_4_;
    fVar52 = in_XMM7._0_4_;
    fVar42 = in_XMM7._4_4_;
    fVar53 = in_XMM7._8_4_;
    fVar14 = in_XMM0._0_4_;
    fVar27 = in_XMM0._4_4_;
    fVar33 = in_XMM0._8_4_;
    auVar19._0_4_ = fVar52 * fVar37 - fVar42 * fVar36;
    fVar20 = fVar42 * fVar39 - fVar53 * fVar37;
    fVar21 = fVar53 * fVar36 - fVar52 * fVar39;
    auVar22._4_4_ = fVar21;
    auVar22._0_4_ = fVar20;
    auVar22._8_4_ = auVar19._0_4_;
    auVar22._12_4_ = in_XMM7._12_4_ * fVar50 - in_XMM7._12_4_ * fVar50;
    auVar29._0_4_ = fVar36 * fVar27 - fVar37 * fVar14;
    auVar29._4_4_ = fVar37 * fVar33 - fVar39 * fVar27;
    auVar29._8_4_ = fVar39 * fVar14 - fVar36 * fVar33;
    auVar29._12_4_ = fVar50 * in_XMM0._12_4_ - fVar50 * in_XMM0._12_4_;
    fVar36 = fVar27 * fVar53 - fVar33 * fVar42;
    auVar16 = dpps(in_XMM0,auVar22,0x7f);
    auVar30 = insertps(auVar29,auVar29,0x4a);
    auVar19._4_4_ = auVar29._0_4_;
    auVar19._8_4_ = fVar14 * fVar42 - fVar27 * fVar52;
    auVar19._12_4_ = 0;
    auVar25._4_4_ = fVar36;
    auVar25._0_4_ = fVar20;
    auVar25._8_4_ = fVar36;
    auVar25._12_4_ = auVar30._4_4_;
    auVar24._8_8_ = auVar25._8_8_;
    auVar24._4_4_ = auVar30._0_4_;
    auVar24._0_4_ = fVar20;
    auVar23._4_4_ = auVar30._8_4_;
    auVar23._0_4_ = fVar21;
    auVar23._8_4_ = fVar33 * fVar52 - fVar14 * fVar53;
    auVar23._12_4_ = auVar30._12_4_;
    auVar17._0_4_ = auVar16._0_4_;
    auVar17._4_4_ = auVar17._0_4_;
    auVar17._8_4_ = auVar17._0_4_;
    auVar17._12_4_ = auVar17._0_4_;
    auVar26 = divps(auVar24,auVar17);
    auVar30 = divps(auVar23,auVar17);
    auVar16 = divps(auVar19,auVar17);
    fVar46 = auVar34._0_4_;
    fVar48 = auVar34._4_4_;
    fVar54 = auVar34._8_4_;
    fVar14 = auVar16._0_4_;
    fVar27 = auVar16._4_4_;
    fVar33 = auVar16._8_4_;
    fVar20 = auVar16._12_4_;
    fVar21 = auVar30._0_4_;
    fVar36 = auVar30._4_4_;
    fVar37 = auVar30._8_4_;
    fVar39 = auVar30._12_4_;
    fVar50 = auVar26._0_4_;
    fVar52 = auVar26._4_4_;
    fVar42 = auVar26._8_4_;
    fVar53 = auVar26._12_4_;
    p_Var13 = *(_func_int **)&pGVar6->field_0x58;
    if (p_Var13 == (_func_int *)0x0) {
      p_Var13 = pGVar6[1].super_RefCount._vptr_RefCount
                [*(uint *)(*(long *)&pGVar6[1].time_range.upper +
                          uVar11 * (long)pGVar6[1].intersectionFilterN)];
    }
    aVar2 = (ray->org).field_0.field_1;
    fVar38 = aVar2.x;
    fVar40 = aVar2.y;
    fVar41 = aVar2.z;
    aVar3 = (ray->dir).field_0.field_1;
    fVar43 = aVar3.x;
    fVar45 = aVar3.y;
    fVar47 = aVar3.z;
    auVar31._0_4_ =
         fVar38 * fVar50 +
         fVar40 * fVar21 + (fVar41 * fVar14 - (fVar46 * fVar50 + fVar48 * fVar21 + fVar54 * fVar14))
    ;
    auVar31._4_4_ =
         fVar38 * fVar52 +
         fVar40 * fVar36 + (fVar41 * fVar27 - (fVar46 * fVar52 + fVar48 * fVar36 + fVar54 * fVar27))
    ;
    auVar31._8_4_ =
         fVar38 * fVar42 +
         fVar40 * fVar37 + (fVar41 * fVar33 - (fVar46 * fVar42 + fVar48 * fVar37 + fVar54 * fVar33))
    ;
    auVar31._12_4_ =
         fVar38 * fVar53 +
         fVar40 * fVar39 + (fVar41 * fVar20 - (fVar46 * fVar53 + fVar48 * fVar39 + fVar54 * fVar20))
    ;
    aVar32.field_1 =
         (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
         blendps(auVar31,aVar2,8);
    (ray->org).field_0 = aVar32;
    auVar18._0_4_ = fVar43 * fVar50 + fVar45 * fVar21 + fVar47 * fVar14;
    auVar18._4_4_ = fVar43 * fVar52 + fVar45 * fVar36 + fVar47 * fVar27;
    auVar18._8_4_ = fVar43 * fVar42 + fVar45 * fVar37 + fVar47 * fVar33;
    auVar18._12_4_ = fVar43 * fVar53 + fVar45 * fVar39 + fVar47 * fVar20;
    aVar32.field_1 =
         (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
         blendps(auVar18,aVar3,8);
    (ray->dir).field_0 = aVar32;
    (**(code **)(p_Var13 + 0x80))(p_Var13 + 0x58,ray);
    local_48 = aVar2._0_8_;
    uStack_40 = aVar2._8_8_;
    *(undefined8 *)&(ray->org).field_0 = local_48;
    *(undefined8 *)((long)&(ray->org).field_0 + 8) = uStack_40;
    local_38 = aVar3._0_8_;
    uStack_30 = aVar3._8_8_;
    *(undefined8 *)&(ray->dir).field_0 = local_38;
    *(undefined8 *)((long)&(ray->dir).field_0 + 8) = uStack_30;
    bVar10 = ray->tfar <= 0.0 && ray->tfar != 0.0;
    pRVar7->instID[0] = 0xffffffff;
    pRVar7->instPrimID[0] = 0xffffffff;
  }
  return bVar10;
}

Assistant:

bool InstanceArrayIntersector1::occluded(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
    {
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;
      
      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      if ((ray.mask & instance->mask) == 0) 
        return false;
#endif
      
      RTCRayQueryContext* user_context = context->user;
      bool occluded = false;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_);
        Accel* object = instance->getObject(prim.primID_);
        const Vec3ff ray_org = ray.org;
        const Vec3ff ray_dir = ray.dir;
        ray.org = Vec3ff(xfmPoint(world2local, ray_org), ray.tnear());
        ray.dir = Vec3ff(xfmVector(world2local, ray_dir), ray.time());
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.occluded((RTCRay&)ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        occluded = ray.tfar < 0.0f;
        instance_id_stack::pop(user_context);
      }
      return occluded;
    }